

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CBufferMapRange<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CBufferMapRange<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  GLboolean GVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  void *pvVar4;
  uint uVar5;
  uint widthRef;
  uint uVar6;
  uint in_R9D;
  uint uVar7;
  ulong uVar8;
  CDataArray dataRef;
  DIResult result;
  uint in_stack_ffffffffffffedb0;
  _func_int **data;
  undefined1 local_1230 [384];
  undefined1 local_10b0 [384];
  long local_f30;
  DILogger local_f28;
  DILogger local_da8;
  DILogger local_c28;
  DILogger local_aa8;
  DILogger local_928;
  DILogger local_7a8;
  DILogger local_628;
  DILogger local_4a8;
  DILogger local_328;
  DILogger local_1a8;
  
  local_10b0[0] = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_10b0 + 8));
  local_f30 = 0;
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffer);
  data = (_func_int **)0x0;
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar6 = 0x4000;
  if ((int)*(uint *)CONCAT44(extraout_var,iVar2) < 0x4000) {
    uVar6 = *(uint *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar7 = *(uint *)(CONCAT44(extraout_var_00,iVar2) + 4);
  uVar8 = (ulong)uVar7;
  if ((int)(0x10000 / (long)(int)uVar6) < (int)uVar7) {
    uVar8 = 0x10000 / (long)(int)uVar6 & 0xffffffff;
  }
  uVar7 = (uint)uVar8;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&stack0xffffffffffffedb8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar6,uVar7,0x1e,0x32,
             in_R9D);
  glu::CallLogWrapper::glBufferData(this_00,0x8f3f,-(long)data,data,0x88e8);
  lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
  DIResult::sub_result(&local_1a8,(DIResult *)local_10b0,lVar3);
  DILogger::~DILogger(&local_1a8);
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,-(long)data,1);
  if (pvVar4 == (void *)0x0) {
    local_f30 = -1;
    local_1230[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_1230,
               (char (*) [68])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL")
    ;
    DILogger::~DILogger((DILogger *)local_1230);
  }
  else {
    lVar3 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&stack0xffffffffffffedb8,(CDataArray *)(ulong)uVar6,uVar7
                       ,(uint)pvVar4,(void *)(ulong)uVar6,uVar7,0,in_stack_ffffffffffffedb0,
                       (uint)data);
    DIResult::sub_result(&local_328,(DIResult *)local_10b0,lVar3);
    DILogger::~DILogger(&local_328);
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\x01',35000,1,0,-(long)data);
    DIResult::sub_result(&local_4a8,(DIResult *)local_10b0,lVar3);
    DILogger::~DILogger(&local_4a8);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 == '\0') {
      local_f30 = -1;
      local_1230[0] = (DILogger)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
      if (local_1230[0] == (DILogger)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1230 + 8),
                   "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE",0x4a
                  );
      }
      DILogger::~DILogger((DILogger *)local_1230);
    }
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_628,(DIResult *)local_10b0,lVar3);
    DILogger::~DILogger(&local_628);
  }
  pvVar4 = glu::CallLogWrapper::glMapBufferRange
                     (this_00,0x8f3f,0,-(long)data >> 1 & 0xfffffffffffffffc,2);
  if (pvVar4 == (void *)0x0) {
    local_f30 = -1;
    local_1230[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_1230,
               (char (*) [74])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL");
    DILogger::~DILogger((DILogger *)local_1230);
  }
  else {
    uVar5 = (int)((int)(uVar8 >> 0x1f) + uVar7) >> 1;
    lVar3 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&stack0xffffffffffffedb8,(CDataArray *)(ulong)uVar6,uVar5
                       ,(uint)pvVar4,(void *)(ulong)uVar6,uVar5,0,in_stack_ffffffffffffedb0,
                       (uint)data);
    DIResult::sub_result(&local_7a8,(DIResult *)local_10b0,lVar3);
    DILogger::~DILogger(&local_7a8);
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,2,0,
                       -(long)data >> 1 & 0xfffffffffffffffc);
    DIResult::sub_result(&local_928,(DIResult *)local_10b0,lVar3);
    DILogger::~DILogger(&local_928);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 == '\0') {
      local_f30 = -1;
      local_1230[0] = (DILogger)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
      if (local_1230[0] == (DILogger)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1230 + 8),
                   "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE",0x4a
                  );
      }
      DILogger::~DILogger((DILogger *)local_1230);
    }
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_aa8,(DIResult *)local_10b0,lVar3);
    DILogger::~DILogger(&local_aa8);
  }
  pvVar4 = glu::CallLogWrapper::glMapBufferRange
                     (this_00,0x8f3f,-(long)data >> 2 & 0xfffffffffffffffc,
                      -(long)data >> 1 & 0xfffffffffffffffc,2);
  if (pvVar4 == (void *)0x0) {
    local_f30 = -1;
    local_1230[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_1230,
               (char (*) [74])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL");
    DILogger::~DILogger((DILogger *)local_1230);
  }
  else {
    widthRef = (int)((int)(uVar8 >> 0x1f) + uVar7) >> 1;
    uVar5 = uVar7 + 3;
    if (-1 < (int)uVar7) {
      uVar5 = uVar7;
    }
    lVar3 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&stack0xffffffffffffedb8,(CDataArray *)(ulong)uVar6,
                       widthRef,(uint)pvVar4,(void *)(ulong)uVar6,widthRef,(int)uVar5 >> 2,
                       in_stack_ffffffffffffedb0,(uint)data);
    DIResult::sub_result(&local_c28,(DIResult *)local_10b0,lVar3);
    DILogger::~DILogger(&local_c28);
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,2,
                       -(long)data >> 2 & 0xfffffffffffffffc,-(long)data >> 1 & 0xfffffffffffffffc);
    DIResult::sub_result(&local_da8,(DIResult *)local_10b0,lVar3);
    DILogger::~DILogger(&local_da8);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 == '\0') {
      local_f30 = -1;
      local_1230[0] = (DILogger)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
      if (local_1230[0] == (DILogger)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1230 + 8),
                   "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE",0x4a
                  );
      }
      DILogger::~DILogger((DILogger *)local_1230);
    }
    lVar3 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_f28,(DIResult *)local_10b0,lVar3);
    DILogger::~DILogger(&local_f28);
  }
  lVar3 = local_f30;
  if (data != (_func_int **)0x0) {
    operator_delete(data,-(long)data);
  }
  DILogger::~DILogger((DILogger *)local_10b0);
  return lVar3;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 30, 50);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));

		void* buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)),
									 GL_MAP_READ_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_READ_ONLY, GL_MAP_READ_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int)),
							   GL_MAP_WRITE_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight / 2, buf, dataWidth, dataHeight / 2));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT, 0,
												 (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, (GLintptr)(dataRef.size() / 4 * sizeof(unsigned int)),
							   (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int)), GL_MAP_WRITE_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(
				BufferCheck(dataRef, dataWidth, dataHeight / 2, buf, dataWidth, dataHeight / 2, dataHeight / 4));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT,
												 (GLintptr)(dataRef.size() / 4 * sizeof(unsigned int)),
												 (GLsizeiptr)(dataRef.size() / 2 * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		return result.code();
	}